

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::metrics::MetricsTest_testGauge_Test::~MetricsTest_testGauge_Test
          (MetricsTest_testGauge_Test *this)

{
  *(undefined ***)&this->super_MetricsTest = &PTR__MetricsTest_0020f078;
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr(&(this->super_MetricsTest)._metrics);
  InMemoryStatsReporter::~InMemoryStatsReporter(&(this->super_MetricsTest)._metricsReporter);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MetricsTest, testGauge)
{
    constexpr auto gaugeValue = static_cast<int64_t>(3);
    constexpr auto metricName = "jaeger.test-gauge";
    StatsFactoryImpl factory(_metricsReporter);
    auto gauge = factory.createGauge(metricName);
    gauge->update(gaugeValue);
    const auto& gauges = _metricsReporter.gauges();
    ASSERT_EQ(1, gauges.size());
    auto itr = gauges.find(metricName);
    ASSERT_TRUE(itr != std::end(gauges));
    ASSERT_EQ(gaugeValue, itr->second);
}